

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void * uv__thread_start(void *arg)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 *in_RDI;
  thread_ctx ctx;
  thread_ctx *ctx_p;
  
  pcVar1 = (code *)*in_RDI;
  uVar2 = in_RDI[1];
  free(in_RDI);
  (*pcVar1)(uVar2);
  return (void *)0x0;
}

Assistant:

static void* uv__thread_start(void *arg)
#endif
{
  struct thread_ctx *ctx_p;
  struct thread_ctx ctx;

  ctx_p = arg;
  ctx = *ctx_p;
  free(ctx_p);
  ctx.entry(ctx.arg);

  return 0;
}